

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_encoder.c
# Opt level: O1

lzma_ret lzma2_encode(lzma_coder_conflict7 *coder,lzma_mf *mf,uint8_t *out,size_t *out_pos,
                     size_t out_size)

{
  size_t *in_pos;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  lzma_action lVar4;
  uint uVar5;
  uint32_t limit;
  lzma_ret lVar6;
  int iVar7;
  ulong uVar8;
  anon_enum_32 aVar9;
  ulong uVar10;
  long lVar11;
  size_t sVar12;
  ulong uVar13;
  lzma_ret local_84;
  
  uVar8 = *out_pos;
  if (out_size <= uVar8) {
    return LZMA_OK;
  }
  in_pos = &coder->buf_pos;
  do {
    switch(coder->sequence) {
    case SEQ_INDICATOR:
      if ((mf->write_pos - mf->read_pos) + mf->read_ahead == 0) {
        lVar4 = mf->action;
        if (lVar4 == LZMA_FINISH) {
          *out_pos = uVar8 + 1;
          out[uVar8] = '\0';
        }
        return (uint)(lVar4 != LZMA_RUN);
      }
      if ((coder->need_state_reset == true) &&
         (lVar6 = lzma_lzma_encoder_reset((lzma_coder_conflict9 *)coder->lzma,&coder->opt_cur),
         lVar6 != LZMA_OK)) {
        return lVar6;
      }
      coder->uncompressed_size = 0;
      coder->compressed_size = 0;
      coder->sequence = SEQ_BLOCK_HEADER;
switchD_004eef8b_caseD_1:
      uVar5 = 0x200000 - (int)coder->uncompressed_size;
      limit = 0;
      if (mf->match_len_max <= uVar5) {
        limit = (uVar5 + mf->read_pos) - (mf->match_len_max + mf->read_ahead);
      }
      uVar2 = mf->read_pos;
      uVar3 = mf->read_ahead;
      lVar6 = lzma_lzma_encode((lzma_coder_conflict9 *)coder->lzma,mf,coder->buf + 6,
                               &coder->compressed_size,0x10000,limit);
      uVar5 = mf->read_ahead;
      uVar10 = (ulong)(((uVar3 + mf->read_pos) - uVar5) - uVar2) + coder->uncompressed_size;
      coder->uncompressed_size = uVar10;
      uVar8 = coder->compressed_size;
      if (0x10000 < uVar8) {
        __assert_fail("coder->compressed_size <= LZMA2_CHUNK_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                      ,200,
                      "lzma_ret lzma2_encode(lzma_coder *restrict, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t)"
                     );
      }
      if (0x200000 < uVar10) {
        __assert_fail("coder->uncompressed_size <= LZMA2_UNCOMPRESSED_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                      ,0xc9,
                      "lzma_ret lzma2_encode(lzma_coder *restrict, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t)"
                     );
      }
      if (lVar6 == LZMA_STREAM_END) {
        if (uVar8 < uVar10) {
          if (uVar8 == 0) {
            __assert_fail("coder->compressed_size > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                          ,0x3e,"void lzma2_header_lzma(lzma_coder *)");
          }
          _Var1 = coder->need_properties;
          if (_Var1 == true) {
            if (coder->need_dictionary_reset == true) {
              coder->buf[0] = 0xe0;
            }
            else {
              coder->buf[0] = 0xc0;
            }
            sVar12 = 0;
          }
          else {
            if (coder->need_state_reset == true) {
              coder->buf[1] = 0xa0;
            }
            else {
              coder->buf[1] = 0x80;
            }
            sVar12 = 1;
          }
          coder->buf_pos = sVar12;
          lVar11 = uVar10 - 1;
          coder->buf[sVar12] = coder->buf[sVar12] + (char)((ulong)lVar11 >> 0x10);
          coder->buf[sVar12 + 1] = (uint8_t)((ulong)lVar11 >> 8);
          coder->buf[sVar12 + 2] = (uint8_t)lVar11;
          coder->buf[sVar12 + 3] = (uint8_t)(uVar8 - 1 >> 8);
          coder->buf[sVar12 + 4] = (uint8_t)(uVar8 - 1);
          if (_Var1 != false) {
            lzma_lzma_lclppb_encode(&coder->opt_cur,coder->buf + sVar12 + 5);
          }
          coder->need_properties = false;
          coder->need_state_reset = false;
          coder->need_dictionary_reset = false;
          coder->compressed_size = coder->compressed_size + 6;
          iVar7 = 0;
          aVar9 = SEQ_BLOCK;
        }
        else {
          uVar10 = uVar10 + uVar5;
          coder->uncompressed_size = uVar10;
          if (0x200000 < uVar10) {
            __assert_fail("coder->uncompressed_size <= LZMA2_UNCOMPRESSED_MAX",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                          ,0xd4,
                          "lzma_ret lzma2_encode(lzma_coder *restrict, lzma_mf *restrict, uint8_t *restrict, size_t *restrict, size_t)"
                         );
          }
          mf->read_ahead = 0;
          if (uVar10 == 0) {
            __assert_fail("coder->uncompressed_size > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                          ,0x72,"void lzma2_header_uncompressed(lzma_coder *)");
          }
          if (0x10000 < uVar10) {
            __assert_fail("coder->uncompressed_size <= LZMA2_CHUNK_MAX",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma2_encoder.c"
                          ,0x73,"void lzma2_header_uncompressed(lzma_coder *)");
          }
          if (coder->need_dictionary_reset == true) {
            coder->buf[0] = '\x01';
          }
          else {
            coder->buf[0] = '\x02';
          }
          coder->buf[1] = (uint8_t)((uint)((int)uVar10 + -1) >> 8);
          coder->buf[2] = (char)uVar10 + 0xff;
          coder->buf_pos = 0;
          coder->need_state_reset = true;
          coder->need_dictionary_reset = false;
          iVar7 = 4;
          aVar9 = SEQ_CODER_INIT;
        }
        coder->sequence = aVar9;
      }
      else {
        local_84 = LZMA_OK;
        iVar7 = 1;
      }
      if (iVar7 == 0) {
switchD_004eef8b_caseD_2:
        lzma_bufcpy(coder->buf,in_pos,coder->compressed_size,out,out_pos,out_size);
        if (coder->buf_pos != coder->compressed_size) {
          return LZMA_OK;
        }
LAB_004ef2bb:
        coder->sequence = SEQ_INDICATOR;
      }
      else if (iVar7 != 4) {
        return local_84;
      }
switchD_004eef8b_default:
      uVar8 = *out_pos;
      if (out_size <= uVar8) {
        return LZMA_OK;
      }
      break;
    case SEQ_BLOCK_HEADER:
      goto switchD_004eef8b_caseD_1;
    case SEQ_BLOCK:
      goto switchD_004eef8b_caseD_2;
    case SEQ_CODER_INIT:
      lzma_bufcpy(coder->buf,in_pos,3,out,out_pos,out_size);
      if (*in_pos != 3) {
        return LZMA_OK;
      }
      coder->sequence = SEQ_CODE;
    case SEQ_CODE:
      if (mf->read_ahead != 0) {
        __assert_fail("mf->read_ahead == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder.h"
                      ,0x11e,"void mf_read(lzma_mf *, uint8_t *, size_t *, size_t, size_t *)");
      }
      uVar8 = coder->uncompressed_size;
      if (mf->read_pos < uVar8) {
        __assert_fail("mf->read_pos >= *left",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder.h"
                      ,0x11f,"void mf_read(lzma_mf *, uint8_t *, size_t *, size_t, size_t *)");
      }
      sVar12 = *out_pos;
      uVar13 = out_size - sVar12;
      uVar10 = uVar8;
      if (uVar13 < uVar8) {
        uVar10 = uVar13;
      }
      memcpy(out + sVar12,mf->buffer + (mf->read_pos - uVar8),uVar10);
      *out_pos = sVar12 + uVar10;
      coder->uncompressed_size = uVar8 - uVar10;
      if (uVar13 < uVar8) {
        return LZMA_OK;
      }
      goto LAB_004ef2bb;
    default:
      goto switchD_004eef8b_default;
    }
  } while( true );
}

Assistant:

static lzma_ret
lzma2_encode(lzma_coder *LZMA_RESTRICT coder, lzma_mf *LZMA_RESTRICT mf,
		uint8_t *LZMA_RESTRICT out, size_t *LZMA_RESTRICT out_pos,
		size_t out_size)
{
	while (*out_pos < out_size)
	switch (coder->sequence) {
	case SEQ_INIT:
		// If there's no input left and we are flushing or finishing,
		// don't start a new chunk.
		if (mf_unencoded(mf) == 0) {
			// Write end of payload marker if finishing.
			if (mf->action == LZMA_FINISH)
				out[(*out_pos)++] = 0;

			return mf->action == LZMA_RUN
					? LZMA_OK : LZMA_STREAM_END;
		}

		if (coder->need_state_reset)
			return_if_error(lzma_lzma_encoder_reset(
					coder->lzma, &coder->opt_cur));

		coder->uncompressed_size = 0;
		coder->compressed_size = 0;
		coder->sequence = SEQ_LZMA_ENCODE;

	// Fall through

	case SEQ_LZMA_ENCODE: {
		uint32_t read_start;
		lzma_ret ret;

		// Calculate how much more uncompressed data this chunk
		// could accept.
		const uint32_t left = LZMA2_UNCOMPRESSED_MAX
				- coder->uncompressed_size;
		uint32_t limit;

		if (left < mf->match_len_max) {
			// Must flush immediately since the next LZMA symbol
			// could make the uncompressed size of the chunk too
			// big.
			limit = 0;
		} else {
			// Calculate maximum read_limit that is OK from point
			// of view of LZMA2 chunk size.
			limit = mf->read_pos - mf->read_ahead
					+ left - mf->match_len_max;
		}

		// Save the start position so that we can update
		// coder->uncompressed_size.
		read_start = mf->read_pos - mf->read_ahead;

		// Call the LZMA encoder until the chunk is finished.
		ret = lzma_lzma_encode(coder->lzma, mf,
				coder->buf + LZMA2_HEADER_MAX,
				&coder->compressed_size,
				LZMA2_CHUNK_MAX, limit);

		coder->uncompressed_size += mf->read_pos - mf->read_ahead
				- read_start;

		assert(coder->compressed_size <= LZMA2_CHUNK_MAX);
		assert(coder->uncompressed_size <= LZMA2_UNCOMPRESSED_MAX);

		if (ret != LZMA_STREAM_END)
			return LZMA_OK;

		// See if the chunk compressed. If it didn't, we encode it
		// as uncompressed chunk. This saves a few bytes of space
		// and makes decoding faster.
		if (coder->compressed_size >= coder->uncompressed_size) {
			coder->uncompressed_size += mf->read_ahead;
			assert(coder->uncompressed_size
					<= LZMA2_UNCOMPRESSED_MAX);
			mf->read_ahead = 0;
			lzma2_header_uncompressed(coder);
			coder->need_state_reset = true;
			coder->sequence = SEQ_UNCOMPRESSED_HEADER;
			break;
		}

		// The chunk did compress at least by one byte, so we store
		// the chunk as LZMA.
		lzma2_header_lzma(coder);

		coder->sequence = SEQ_LZMA_COPY;
	}

	// Fall through

	case SEQ_LZMA_COPY:
		// Copy the compressed chunk along its headers to the
		// output buffer.
		lzma_bufcpy(coder->buf, &coder->buf_pos,
				coder->compressed_size,
				out, out_pos, out_size);
		if (coder->buf_pos != coder->compressed_size)
			return LZMA_OK;

		coder->sequence = SEQ_INIT;
		break;

	case SEQ_UNCOMPRESSED_HEADER:
		// Copy the three-byte header to indicate uncompressed chunk.
		lzma_bufcpy(coder->buf, &coder->buf_pos,
				LZMA2_HEADER_UNCOMPRESSED,
				out, out_pos, out_size);
		if (coder->buf_pos != LZMA2_HEADER_UNCOMPRESSED)
			return LZMA_OK;

		coder->sequence = SEQ_UNCOMPRESSED_COPY;

	// Fall through

	case SEQ_UNCOMPRESSED_COPY:
		// Copy the uncompressed data as is from the dictionary
		// to the output buffer.
		mf_read(mf, out, out_pos, out_size, &coder->uncompressed_size);
		if (coder->uncompressed_size != 0)
			return LZMA_OK;

		coder->sequence = SEQ_INIT;
		break;
	}

	return LZMA_OK;
}